

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O2

void __thiscall uint256_tests::basics::test_method(basics *this)

{
  uint uVar1;
  char *pcVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator pvVar5;
  iterator in_R9;
  undefined1 *puVar6;
  _Storage<uint160,_true> *p_Var7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 local_a0 [32];
  bool local_80;
  _Storage<uint160,_true> local_78;
  char local_64;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  undefined1 **ppuVar2;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_a8 = "";
  ppuVar2 = &local_c0;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x42;
  file.m_begin = (iterator)&local_b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar2,msg);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_c8 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_58,(base_blob<256u> *)R1L);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)R1Array,(uchar *)0x20,uVar1);
  pvVar5 = (iterator)0x2;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_d0,0x42,1,2,pvVar4,"R1L.ToString()",&local_78,
             "ArrayToString(R1Array,32)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_d8 = "";
  ppuVar2 = &local_f0;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x43;
  file_00.m_begin = (iterator)&local_e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppuVar2,msg_00);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_f8 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)local_58,R1S);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)R1Array,(uchar *)0x14,uVar1);
  pvVar5 = (iterator)0x2;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_100,0x43,1,2,pvVar4,"R1S.ToString()",&local_78,
             "ArrayToString(R1Array,20)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_108 = "";
  ppuVar2 = &local_120;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x44;
  file_01.m_begin = (iterator)&local_110;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar2,msg_01);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_128 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_58,(base_blob<256u> *)R2L);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)R2Array,(uchar *)0x20,uVar1);
  pvVar5 = (iterator)0x2;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_130,0x44,1,2,pvVar4,"R2L.ToString()",&local_78,
             "ArrayToString(R2Array,32)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_138 = "";
  ppuVar2 = &local_150;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x45;
  file_02.m_begin = (iterator)&local_140;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar2,msg_02);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_158 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)local_58,R2S);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)R2Array,(uchar *)0x14,uVar1);
  pvVar5 = (iterator)0x2;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_160,0x45,1,2,pvVar4,"R2S.ToString()",&local_78,
             "ArrayToString(R2Array,20)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_168 = "";
  ppuVar2 = &local_180;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0x46;
  file_03.m_begin = (iterator)&local_170;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)ppuVar2,msg_03);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_188 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_58,(base_blob<256u> *)ZeroL);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)ZeroArray,(uchar *)0x20,uVar1);
  pvVar5 = (iterator)0x2;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_190,0x46,1,2,pvVar4,"ZeroL.ToString()",&local_78,
             "ArrayToString(ZeroArray,32)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_198 = "";
  ppuVar2 = &local_1b0;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0x47;
  file_04.m_begin = (iterator)&local_1a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)ppuVar2,msg_04);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1b8 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)local_58,ZeroS);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)ZeroArray,(uchar *)0x14,uVar1);
  pvVar5 = (iterator)0x2;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_1c0,0x47,1,2,pvVar4,"ZeroS.ToString()",&local_78,
             "ArrayToString(ZeroArray,20)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1c8 = "";
  ppuVar2 = &local_1e0;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar5;
  file_05.m_end = (iterator)0x48;
  file_05.m_begin = (iterator)&local_1d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)ppuVar2,msg_05);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1e8 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_58,(base_blob<256u> *)OneL);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)OneArray,(uchar *)0x20,uVar1);
  pvVar5 = (iterator)0x2;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_1f0,0x48,1,2,pvVar4,"OneL.ToString()",&local_78,
             "ArrayToString(OneArray,32)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1f8 = "";
  ppuVar2 = &local_210;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar5;
  file_06.m_end = (iterator)0x49;
  file_06.m_begin = (iterator)&local_200;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)ppuVar2,msg_06);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_218 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)local_58,OneS);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)OneArray,(uchar *)0x14,uVar1);
  pvVar5 = (iterator)0x2;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_220,0x49,1,2,pvVar4,"OneS.ToString()",&local_78,
             "ArrayToString(OneArray,20)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_228 = "";
  ppuVar2 = &local_240;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar5;
  file_07.m_end = (iterator)0x4a;
  file_07.m_begin = (iterator)&local_230;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)ppuVar2,msg_07);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_248 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_58,(base_blob<256u> *)MaxL);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)MaxArray,(uchar *)0x20,uVar1);
  pvVar5 = (iterator)0x2;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_250,0x4a,1,2,pvVar4,"MaxL.ToString()",&local_78,
             "ArrayToString(MaxArray,32)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_258 = "";
  ppuVar2 = &local_270;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar5;
  file_08.m_end = (iterator)0x4b;
  file_08.m_begin = (iterator)&local_260;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)ppuVar2,msg_08);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_278 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)local_58,MaxS);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)MaxArray,(uchar *)0x14,uVar1);
  pvVar5 = (iterator)0x2;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_280,0x4b,1,2,pvVar4,"MaxS.ToString()",&local_78,
             "ArrayToString(MaxArray,20)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_288 = "";
  ppuVar2 = &local_2a0;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar5;
  file_09.m_end = (iterator)0x4c;
  file_09.m_begin = (iterator)&local_290;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)ppuVar2,msg_09);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2a8 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_58,(base_blob<256u> *)OneL);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)ZeroArray,(uchar *)0x20,uVar1);
  pvVar5 = (iterator)0x3;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_2b0,0x4c,1,3,pvVar4,"OneL.ToString()",&local_78,
             "ArrayToString(ZeroArray,32)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2b8 = "";
  ppuVar2 = &local_2d0;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar5;
  file_10.m_end = (iterator)0x4d;
  file_10.m_begin = (iterator)&local_2c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)ppuVar2,msg_10);
  uVar1 = (uint)ppuVar2;
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2d8 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)local_58,OneS);
  ArrayToString_abi_cxx11_
            ((string *)&local_78._M_value,(uint256_tests *)ZeroArray,(uchar *)0x14,uVar1);
  pvVar5 = (iterator)0x3;
  pvVar4 = local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,std::__cxx11::string,std::__cxx11::string>
            (local_a0,&local_2e0,0x4d,1,3,pvVar4,"OneS.ToString()",&local_78,
             "ArrayToString(ZeroArray,20)");
  std::__cxx11::string::~string((string *)&local_78._M_value);
  std::__cxx11::string::~string((string *)local_58);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar5;
  file_11.m_end = &DAT_00000050;
  file_11.m_begin = (iterator)&local_2f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_300,
             msg_11);
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_308 = "";
  puVar6 = R1L;
  pvVar4 = (iterator)0x3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
            (local_a0,&local_310,0x50,1,3,R1L,"R1L",R2L,"R2L");
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = puVar6;
  msg_12.m_begin = pvVar4;
  file_12.m_end = &DAT_00000050;
  file_12.m_begin = (iterator)&local_320;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_330,
             msg_12);
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_338 = "";
  puVar6 = R1S;
  pvVar4 = (iterator)0x3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
            (local_a0,&local_340,0x50,1,3,R1S,"R1S",R2S,"R2S");
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = puVar6;
  msg_13.m_begin = pvVar4;
  file_13.m_end = (iterator)0x51;
  file_13.m_begin = (iterator)&local_350;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_360,
             msg_13);
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_368 = "";
  pvVar4 = (iterator)0x3;
  puVar6 = ZeroL;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
            (local_a0,&local_370,0x51,1,3,ZeroL,"ZeroL",OneL,"OneL");
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = puVar6;
  msg_14.m_begin = pvVar4;
  file_14.m_end = (iterator)0x51;
  file_14.m_begin = (iterator)&local_380;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_390,
             msg_14);
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_398 = "";
  pvVar4 = (iterator)0x3;
  puVar6 = ZeroS;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
            (local_a0,&local_3a0,0x51,1,3,ZeroS,"ZeroS",OneS,"OneS");
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = puVar6;
  msg_15.m_begin = pvVar4;
  file_15.m_end = (iterator)0x52;
  file_15.m_begin = (iterator)&local_3b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3c0,
             msg_15);
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_3c8 = "";
  pvVar4 = (iterator)0x3;
  puVar6 = OneL;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
            (local_a0,&local_3d0,0x52,1,3,OneL,"OneL",ZeroL,"ZeroL");
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = puVar6;
  msg_16.m_begin = pvVar4;
  file_16.m_end = (iterator)0x52;
  file_16.m_begin = (iterator)&local_3e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_3f0,
             msg_16);
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_3f8 = "";
  pvVar4 = (iterator)0x3;
  puVar6 = OneS;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
            (local_a0,&local_400,0x52,1,3,OneS,"OneS",ZeroS,"ZeroS");
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = puVar6;
  msg_17.m_begin = pvVar4;
  file_17.m_end = (iterator)0x53;
  file_17.m_begin = (iterator)&local_410;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_420,
             msg_17);
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_428 = "";
  puVar6 = MaxL;
  pvVar4 = (iterator)0x3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
            (local_a0,&local_430,0x53,1,3,MaxL,"MaxL",ZeroL,"ZeroL");
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = puVar6;
  msg_18.m_begin = pvVar4;
  file_18.m_end = (iterator)0x53;
  file_18.m_begin = (iterator)&local_440;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_450,
             msg_18);
  local_a0[8] = '\0';
  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_458 = "";
  puVar6 = MaxS;
  pvVar4 = (iterator)0x3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
            (local_a0,&local_460,0x53,1,3,MaxS,"MaxS",ZeroS,"ZeroS");
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = puVar6;
  msg_19.m_begin = pvVar4;
  file_19.m_end = (iterator)0x56;
  file_19.m_begin = (iterator)&local_470;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_480,
             msg_19);
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pcVar3 = "";
  local_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_488 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&local_78._M_value,(base_blob<256u> *)R1L);
  str._M_str = pcVar3;
  str._M_len = local_78._0_8_;
  detail::FromHex<uint256>((optional<uint256> *)local_a0,(detail *)local_78._8_8_,str);
  if (local_80 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    pvVar5 = (iterator)0x2;
    pvVar4 = local_a0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_58,&local_490,0x56,1,2,pvVar4,"uint256::FromHex(R1L.ToString()).value()",R1L,
               "R1L");
    std::__cxx11::string::~string((string *)&local_78._M_value);
    local_4a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_498 = "";
    ppuVar2 = &local_4b0;
    local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_20.m_end = pvVar4;
    msg_20.m_begin = pvVar5;
    file_20.m_end = (iterator)0x57;
    file_20.m_begin = (iterator)&local_4a0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)ppuVar2,msg_20
              );
    local_58._8_4_ = local_58._8_4_ & 0xffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_01139f30;
    local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_4c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_4b8 = "";
    base_blob<256u>::ToString_abi_cxx11_((string *)&local_78._M_value,(base_blob<256u> *)R2L);
    str_00._M_str = (char *)ppuVar2;
    str_00._M_len = local_78._0_8_;
    detail::FromHex<uint256>((optional<uint256> *)local_a0,(detail *)local_78._8_8_,str_00);
    if (local_80 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      pvVar5 = (iterator)0x2;
      pvVar4 = local_a0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                (local_58,&local_4c0,0x57,1,2,pvVar4,"uint256::FromHex(R2L.ToString()).value()",R2L,
                 "R2L");
      std::__cxx11::string::~string((string *)&local_78._M_value);
      local_4d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4c8 = "";
      ppuVar2 = &local_4e0;
      local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_21.m_end = pvVar4;
      msg_21.m_begin = pvVar5;
      file_21.m_end = &DAT_00000058;
      file_21.m_begin = (iterator)&local_4d0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)ppuVar2,
                 msg_21);
      local_58._8_4_ = local_58._8_4_ & 0xffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_01139f30;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_4f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4e8 = "";
      base_blob<256u>::ToString_abi_cxx11_((string *)&local_78._M_value,(base_blob<256u> *)ZeroL);
      str_01._M_str = (char *)ppuVar2;
      str_01._M_len = local_78._0_8_;
      detail::FromHex<uint256>((optional<uint256> *)local_a0,(detail *)local_78._8_8_,str_01);
      if (local_80 == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        pvVar5 = (iterator)0x2;
        pvVar4 = local_a0;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                  (local_58,&local_4f0,0x58,1,2,pvVar4,"uint256::FromHex(ZeroL.ToString()).value()",
                   ZeroL,"ZeroL");
        std::__cxx11::string::~string((string *)&local_78._M_value);
        local_500 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_4f8 = "";
        ppuVar2 = &local_510;
        local_510 = &boost::unit_test::basic_cstring<char_const>::null;
        local_508 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_22.m_end = pvVar4;
        msg_22.m_begin = pvVar5;
        file_22.m_end = (iterator)0x59;
        file_22.m_begin = (iterator)&local_500;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)ppuVar2,
                   msg_22);
        local_58._8_4_ = local_58._8_4_ & 0xffffff00;
        local_58._0_8_ = &PTR__lazy_ostream_01139f30;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_520 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_518 = "";
        base_blob<256u>::ToString_abi_cxx11_((string *)&local_78._M_value,(base_blob<256u> *)OneL);
        str_02._M_str = (char *)ppuVar2;
        str_02._M_len = local_78._0_8_;
        detail::FromHex<uint256>((optional<uint256> *)local_a0,(detail *)local_78._8_8_,str_02);
        if (local_80 == false) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          pvVar5 = (iterator)0x2;
          pvVar4 = local_a0;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                    (local_58,&local_520,0x59,1,2,pvVar4,"uint256::FromHex(OneL.ToString()).value()"
                     ,OneL,"OneL");
          std::__cxx11::string::~string((string *)&local_78._M_value);
          local_530 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
          ;
          local_528 = "";
          ppuVar2 = &local_540;
          local_540 = &boost::unit_test::basic_cstring<char_const>::null;
          local_538 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_23.m_end = pvVar4;
          msg_23.m_begin = pvVar5;
          file_23.m_end = (iterator)0x5a;
          file_23.m_begin = (iterator)&local_530;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)ppuVar2,
                     msg_23);
          local_58._8_4_ = local_58._8_4_ & 0xffffff00;
          local_58._0_8_ = &PTR__lazy_ostream_01139f30;
          local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          local_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
          local_550 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
          ;
          local_548 = "";
          base_blob<256u>::ToString_abi_cxx11_((string *)&local_78._M_value,(base_blob<256u> *)MaxL)
          ;
          str_03._M_str = (char *)ppuVar2;
          str_03._M_len = local_78._0_8_;
          detail::FromHex<uint256>((optional<uint256> *)local_a0,(detail *)local_78._8_8_,str_03);
          if (local_80 == false) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            pvVar5 = (iterator)0x2;
            pvVar4 = local_a0;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                      (local_58,&local_550,0x5a,1,2,pvVar4,
                       "uint256::FromHex(MaxL.ToString()).value()",MaxL,"MaxL");
            std::__cxx11::string::~string((string *)&local_78._M_value);
            local_560 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
            ;
            local_558 = "";
            ppuVar2 = &local_570;
            local_570 = &boost::unit_test::basic_cstring<char_const>::null;
            local_568 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_24.m_end = pvVar4;
            msg_24.m_begin = pvVar5;
            file_24.m_end = (iterator)0x5b;
            file_24.m_begin = (iterator)&local_560;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,
                       (size_t)ppuVar2,msg_24);
            local_58._8_4_ = local_58._8_4_ & 0xffffff00;
            local_58._0_8_ = &PTR__lazy_ostream_01139f30;
            local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
            local_580 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
            ;
            local_578 = "";
            str_04._M_str = (char *)ppuVar2;
            str_04._M_len = (size_t)R1ArrayHex;
            detail::FromHex<uint256>((optional<uint256> *)local_a0,(detail *)0x40,str_04);
            if (local_80 == false) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              pvVar5 = (iterator)0x2;
              pvVar4 = local_a0;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                        (local_58,&local_580,0x5b,1,2,pvVar4,"uint256::FromHex(R1ArrayHex).value()",
                         R1L,"R1L");
              local_590 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_588 = "";
              local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_598 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_25.m_end = pvVar4;
              msg_25.m_begin = pvVar5;
              file_25.m_end = (iterator)0x5c;
              file_25.m_begin = (iterator)&local_590;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,
                         (size_t)&local_5a0,msg_25);
              local_a0[8] = '\0';
              local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
              local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
              local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_5b0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_5a8 = "";
              local_48._M_allocated_capacity = R1L._16_8_;
              local_48._8_8_ = R1L._24_8_;
              local_58._4_4_ = R1L._4_4_;
              local_58._0_4_ = R1L._0_4_;
              local_58._8_4_ = R1L._8_4_;
              local_58._12_4_ = R1L._12_4_;
              pvVar4 = local_58;
              pvVar5 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                        (local_a0,&local_5b0,0x5c,1,2,pvVar4,"uint256(R1L)",R1L,"R1L");
              local_5c0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_5b8 = "";
              local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_26.m_end = pvVar4;
              msg_26.m_begin = pvVar5;
              file_26.m_end = (iterator)0x5d;
              file_26.m_begin = (iterator)&local_5c0;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,
                         (size_t)&local_5d0,msg_26);
              local_a0[8] = '\0';
              local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
              local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
              local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_5e0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_5d8 = "";
              local_48._M_allocated_capacity = ZeroL._16_8_;
              local_48._8_8_ = ZeroL._24_8_;
              local_58._4_4_ = ZeroL._4_4_;
              local_58._0_4_ = ZeroL._0_4_;
              local_58._8_4_ = ZeroL._8_4_;
              local_58._12_4_ = ZeroL._12_4_;
              pvVar4 = local_58;
              pvVar5 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                        (local_a0,&local_5e0,0x5d,1,2,pvVar4,"uint256(ZeroL)",ZeroL,"ZeroL");
              local_5f0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_5e8 = "";
              local_600 = &boost::unit_test::basic_cstring<char_const>::null;
              local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_27.m_end = pvVar4;
              msg_27.m_begin = pvVar5;
              file_27.m_end = (iterator)0x5e;
              file_27.m_begin = (iterator)&local_5f0;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,
                         (size_t)&local_600,msg_27);
              local_a0[8] = '\0';
              local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
              local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
              local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_610 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_608 = "";
              local_48._M_allocated_capacity = OneL._16_8_;
              local_48._8_8_ = OneL._24_8_;
              local_58._4_4_ = OneL._4_4_;
              local_58._0_4_ = OneL._0_4_;
              local_58._8_4_ = OneL._8_4_;
              local_58._12_4_ = OneL._12_4_;
              pvVar4 = local_58;
              pvVar5 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                        (local_a0,&local_610,0x5e,1,2,pvVar4,"uint256(OneL)",OneL,"OneL");
              local_620 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_618 = "";
              ppuVar2 = &local_630;
              local_630 = &boost::unit_test::basic_cstring<char_const>::null;
              local_628 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_28.m_end = pvVar4;
              msg_28.m_begin = pvVar5;
              file_28.m_end = (iterator)0x60;
              file_28.m_begin = (iterator)&local_620;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,
                         (size_t)ppuVar2,msg_28);
              local_a0[8] = '\0';
              local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
              local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
              local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_640 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_638 = "";
              base_blob<160u>::ToString_abi_cxx11_((string *)local_58,R1S);
              str_05._M_str = (char *)ppuVar2;
              str_05._M_len = local_58._0_8_;
              detail::FromHex<uint160>
                        ((optional<uint160> *)&local_78._M_value,
                         (detail *)CONCAT44(local_58._12_4_,local_58._8_4_),str_05);
              if (local_64 == '\0') {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_bad_optional_access();
                }
              }
              else {
                pvVar4 = (iterator)0x2;
                p_Var7 = &local_78;
                boost::test_tools::tt_detail::
                check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                          (local_a0,&local_640,0x60,1,2,p_Var7,
                           "uint160::FromHex(R1S.ToString()).value()",R1S,"R1S");
                std::__cxx11::string::~string((string *)local_58);
                local_650 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                ;
                local_648 = "";
                ppuVar2 = &local_660;
                local_660 = &boost::unit_test::basic_cstring<char_const>::null;
                local_658 = &boost::unit_test::basic_cstring<char_const>::null;
                msg_29.m_end = (iterator)p_Var7;
                msg_29.m_begin = pvVar4;
                file_29.m_end = (iterator)0x61;
                file_29.m_begin = (iterator)&local_650;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,
                           (size_t)ppuVar2,msg_29);
                local_a0[8] = '\0';
                local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
                local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
                local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                local_670 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                ;
                local_668 = "";
                base_blob<160u>::ToString_abi_cxx11_((string *)local_58,R2S);
                str_06._M_str = (char *)ppuVar2;
                str_06._M_len = local_58._0_8_;
                detail::FromHex<uint160>
                          ((optional<uint160> *)&local_78._M_value,
                           (detail *)CONCAT44(local_58._12_4_,local_58._8_4_),str_06);
                if (local_64 == '\0') {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    std::__throw_bad_optional_access();
                  }
                }
                else {
                  pvVar4 = (iterator)0x2;
                  p_Var7 = &local_78;
                  boost::test_tools::tt_detail::
                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                            (local_a0,&local_670,0x61,1,2,p_Var7,
                             "uint160::FromHex(R2S.ToString()).value()",R2S,"R2S");
                  std::__cxx11::string::~string((string *)local_58);
                  local_680 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                  ;
                  local_678 = "";
                  ppuVar2 = &local_690;
                  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
                  msg_30.m_end = (iterator)p_Var7;
                  msg_30.m_begin = pvVar4;
                  file_30.m_end = (iterator)0x62;
                  file_30.m_begin = (iterator)&local_680;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,
                             (size_t)ppuVar2,msg_30);
                  local_a0[8] = '\0';
                  local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
                  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
                  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                  local_6a0 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                  ;
                  local_698 = "";
                  base_blob<160u>::ToString_abi_cxx11_((string *)local_58,ZeroS);
                  str_07._M_str = (char *)ppuVar2;
                  str_07._M_len = local_58._0_8_;
                  detail::FromHex<uint160>
                            ((optional<uint160> *)&local_78._M_value,
                             (detail *)CONCAT44(local_58._12_4_,local_58._8_4_),str_07);
                  if (local_64 == '\0') {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      std::__throw_bad_optional_access();
                    }
                  }
                  else {
                    pvVar4 = (iterator)0x2;
                    p_Var7 = &local_78;
                    boost::test_tools::tt_detail::
                    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                              (local_a0,&local_6a0,0x62,1,2,p_Var7,
                               "uint160::FromHex(ZeroS.ToString()).value()",ZeroS,"ZeroS");
                    std::__cxx11::string::~string((string *)local_58);
                    local_6b0 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                    ;
                    local_6a8 = "";
                    ppuVar2 = &local_6c0;
                    local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
                    msg_31.m_end = (iterator)p_Var7;
                    msg_31.m_begin = pvVar4;
                    file_31.m_end = (iterator)0x63;
                    file_31.m_begin = (iterator)&local_6b0;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,
                               (size_t)ppuVar2,msg_31);
                    local_a0[8] = '\0';
                    local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
                    local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
                    local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                    local_6d0 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                    ;
                    local_6c8 = "";
                    base_blob<160u>::ToString_abi_cxx11_((string *)local_58,OneS);
                    str_08._M_str = (char *)ppuVar2;
                    str_08._M_len = local_58._0_8_;
                    detail::FromHex<uint160>
                              ((optional<uint160> *)&local_78._M_value,
                               (detail *)CONCAT44(local_58._12_4_,local_58._8_4_),str_08);
                    if (local_64 == '\0') {
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        std::__throw_bad_optional_access();
                      }
                    }
                    else {
                      pvVar4 = (iterator)0x2;
                      p_Var7 = &local_78;
                      boost::test_tools::tt_detail::
                      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                                (local_a0,&local_6d0,99,1,2,p_Var7,
                                 "uint160::FromHex(OneS.ToString()).value()",OneS,"OneS");
                      std::__cxx11::string::~string((string *)local_58);
                      local_6e0 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                      ;
                      local_6d8 = "";
                      ppuVar2 = &local_6f0;
                      local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
                      msg_32.m_end = (iterator)p_Var7;
                      msg_32.m_begin = pvVar4;
                      file_32.m_end = (iterator)0x64;
                      file_32.m_begin = (iterator)&local_6e0;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,
                                 (size_t)ppuVar2,msg_32);
                      local_a0[8] = '\0';
                      local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
                      local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
                      local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                      local_700 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                      ;
                      local_6f8 = "";
                      base_blob<160u>::ToString_abi_cxx11_((string *)local_58,MaxS);
                      str_09._M_str = (char *)ppuVar2;
                      str_09._M_len = local_58._0_8_;
                      detail::FromHex<uint160>
                                ((optional<uint160> *)&local_78._M_value,
                                 (detail *)CONCAT44(local_58._12_4_,local_58._8_4_),str_09);
                      if (local_64 == '\0') {
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          std::__throw_bad_optional_access();
                        }
                      }
                      else {
                        pvVar4 = (iterator)0x2;
                        p_Var7 = &local_78;
                        boost::test_tools::tt_detail::
                        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                                  (local_a0,&local_700,100,1,2,p_Var7,
                                   "uint160::FromHex(MaxS.ToString()).value()",MaxS,"MaxS");
                        std::__cxx11::string::~string((string *)local_58);
                        local_710 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                        ;
                        local_708 = "";
                        ppuVar2 = &local_720;
                        local_720 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_718 = &boost::unit_test::basic_cstring<char_const>::null;
                        msg_33.m_end = (iterator)p_Var7;
                        msg_33.m_begin = pvVar4;
                        file_33.m_end = (iterator)0x65;
                        file_33.m_begin = (iterator)&local_710;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,
                                   (size_t)ppuVar2,msg_33);
                        local_a0[8] = '\0';
                        local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
                        local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
                        local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                        local_730 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                        ;
                        local_728 = "";
                        str_10._M_str = (char *)ppuVar2;
                        str_10._M_len = 0xc68428;
                        detail::FromHex<uint160>
                                  ((optional<uint160> *)local_58,(detail *)&DAT_00000028,str_10);
                        if (local_48._M_local_buf[4] == '\0') {
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            std::__throw_bad_optional_access();
                          }
                        }
                        else {
                          pvVar5 = (iterator)0x2;
                          pvVar4 = local_58;
                          boost::test_tools::tt_detail::
                          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                                    (local_a0,&local_730,0x65,1,2,pvVar4,
                                     "uint160::FromHex(std::string_view{R1ArrayHex + 24, 40}).value()"
                                     ,R1S,"R1S");
                          local_740 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          local_738 = "";
                          local_750 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_748 = &boost::unit_test::basic_cstring<char_const>::null;
                          msg_34.m_end = pvVar4;
                          msg_34.m_begin = pvVar5;
                          file_34.m_end = (iterator)0x67;
                          file_34.m_begin = (iterator)&local_740;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,
                                     (size_t)&local_750,msg_34);
                          local_a0[8] = '\0';
                          local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
                          local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
                          local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                          local_760 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          local_758 = "";
                          local_48._M_allocated_capacity._0_4_ = R1S._16_4_;
                          local_58._4_4_ = R1S._4_4_;
                          local_58._0_4_ = R1S._0_4_;
                          local_58._8_4_ = R1S._8_4_;
                          local_58._12_4_ = R1S._12_4_;
                          pvVar4 = local_58;
                          pvVar5 = (iterator)0x2;
                          boost::test_tools::tt_detail::
                          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                                    (local_a0,&local_760,0x67,1,2,pvVar4,"uint160(R1S)",R1S,"R1S");
                          local_770 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          local_768 = "";
                          local_780 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_778 = &boost::unit_test::basic_cstring<char_const>::null;
                          msg_35.m_end = pvVar4;
                          msg_35.m_begin = pvVar5;
                          file_35.m_end = &DAT_00000068;
                          file_35.m_begin = (iterator)&local_770;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,
                                     (size_t)&local_780,msg_35);
                          local_a0[8] = '\0';
                          local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
                          local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
                          local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                          local_790 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          local_788 = "";
                          local_48._M_allocated_capacity._0_4_ = ZeroS._16_4_;
                          local_58._4_4_ = ZeroS._4_4_;
                          local_58._0_4_ = ZeroS._0_4_;
                          local_58._8_4_ = ZeroS._8_4_;
                          local_58._12_4_ = ZeroS._12_4_;
                          pvVar4 = local_58;
                          pvVar5 = (iterator)0x2;
                          boost::test_tools::tt_detail::
                          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                                    (local_a0,&local_790,0x68,1,2,pvVar4,"uint160(ZeroS)",ZeroS,
                                     "ZeroS");
                          local_7a0 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          local_798 = "";
                          local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
                          msg_36.m_end = pvVar4;
                          msg_36.m_begin = pvVar5;
                          file_36.m_end = (iterator)0x69;
                          file_36.m_begin = (iterator)&local_7a0;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,
                                     (size_t)&local_7b0,msg_36);
                          local_a0[8] = '\0';
                          local_a0._0_8_ = &PTR__lazy_ostream_01139f30;
                          local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
                          local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                          local_7c0 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          local_7b8 = "";
                          local_48._M_allocated_capacity._0_4_ = OneS._16_4_;
                          local_58._4_4_ = OneS._4_4_;
                          local_58._0_4_ = OneS._0_4_;
                          local_58._8_4_ = OneS._8_4_;
                          local_58._12_4_ = OneS._12_4_;
                          boost::test_tools::tt_detail::
                          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                                    (local_a0,&local_7c0,0x69,1,2,local_58,"uint160(OneS)",OneS,
                                     "OneS");
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            return;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE( basics ) // constructors, equality, inequality
{
    // constructor uint256(vector<char>):
    BOOST_CHECK_EQUAL(R1L.ToString(), ArrayToString(R1Array,32));
    BOOST_CHECK_EQUAL(R1S.ToString(), ArrayToString(R1Array,20));
    BOOST_CHECK_EQUAL(R2L.ToString(), ArrayToString(R2Array,32));
    BOOST_CHECK_EQUAL(R2S.ToString(), ArrayToString(R2Array,20));
    BOOST_CHECK_EQUAL(ZeroL.ToString(), ArrayToString(ZeroArray,32));
    BOOST_CHECK_EQUAL(ZeroS.ToString(), ArrayToString(ZeroArray,20));
    BOOST_CHECK_EQUAL(OneL.ToString(), ArrayToString(OneArray,32));
    BOOST_CHECK_EQUAL(OneS.ToString(), ArrayToString(OneArray,20));
    BOOST_CHECK_EQUAL(MaxL.ToString(), ArrayToString(MaxArray,32));
    BOOST_CHECK_EQUAL(MaxS.ToString(), ArrayToString(MaxArray,20));
    BOOST_CHECK_NE(OneL.ToString(), ArrayToString(ZeroArray,32));
    BOOST_CHECK_NE(OneS.ToString(), ArrayToString(ZeroArray,20));

    // == and !=
    BOOST_CHECK_NE(R1L, R2L); BOOST_CHECK_NE(R1S, R2S);
    BOOST_CHECK_NE(ZeroL, OneL); BOOST_CHECK_NE(ZeroS, OneS);
    BOOST_CHECK_NE(OneL, ZeroL); BOOST_CHECK_NE(OneS, ZeroS);
    BOOST_CHECK_NE(MaxL, ZeroL); BOOST_CHECK_NE(MaxS, ZeroS);

    // String Constructor and Copy Constructor
    BOOST_CHECK_EQUAL(uint256::FromHex(R1L.ToString()).value(), R1L);
    BOOST_CHECK_EQUAL(uint256::FromHex(R2L.ToString()).value(), R2L);
    BOOST_CHECK_EQUAL(uint256::FromHex(ZeroL.ToString()).value(), ZeroL);
    BOOST_CHECK_EQUAL(uint256::FromHex(OneL.ToString()).value(), OneL);
    BOOST_CHECK_EQUAL(uint256::FromHex(MaxL.ToString()).value(), MaxL);
    BOOST_CHECK_EQUAL(uint256::FromHex(R1ArrayHex).value(), R1L);
    BOOST_CHECK_EQUAL(uint256(R1L), R1L);
    BOOST_CHECK_EQUAL(uint256(ZeroL), ZeroL);
    BOOST_CHECK_EQUAL(uint256(OneL), OneL);

    BOOST_CHECK_EQUAL(uint160::FromHex(R1S.ToString()).value(), R1S);
    BOOST_CHECK_EQUAL(uint160::FromHex(R2S.ToString()).value(), R2S);
    BOOST_CHECK_EQUAL(uint160::FromHex(ZeroS.ToString()).value(), ZeroS);
    BOOST_CHECK_EQUAL(uint160::FromHex(OneS.ToString()).value(), OneS);
    BOOST_CHECK_EQUAL(uint160::FromHex(MaxS.ToString()).value(), MaxS);
    BOOST_CHECK_EQUAL(uint160::FromHex(std::string_view{R1ArrayHex + 24, 40}).value(), R1S);

    BOOST_CHECK_EQUAL(uint160(R1S), R1S);
    BOOST_CHECK_EQUAL(uint160(ZeroS), ZeroS);
    BOOST_CHECK_EQUAL(uint160(OneS), OneS);
}